

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-param-util.h
# Opt level: O3

ParamGenerator<std::tuple<int,_int,_int,_int,_int,_void_(*)(const_unsigned_char_*,_int,_int,_int,_int_*)>_>
 __thiscall testing::internal::ValueArray::operator_cast_to_ParamGenerator(ValueArray *this)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  undefined8 *in_RSI;
  ParamGenerator<std::tuple<int,_int,_int,_int,_int,_void_(*)(const_unsigned_char_*,_int,_int,_int,_int_*)>_>
  PVar2;
  initializer_list<std::tuple<int,_int,_int,_int,_int,_void_(*)(const_unsigned_char_*,_int,_int,_int,_int_*)>_>
  __l;
  allocator_type local_91;
  vector<std::tuple<int,_int,_int,_int,_int,_void_(*)(const_unsigned_char_*,_int,_int,_int,_int_*)>,_std::allocator<std::tuple<int,_int,_int,_int,_int,_void_(*)(const_unsigned_char_*,_int,_int,_int,_int_*)>_>_>
  local_90;
  tuple<int,_int,_int,_int,_int,_void_(*)(const_unsigned_char_*,_int,_int,_int,_int_*)> local_78;
  undefined8 local_58;
  undefined4 uStack_50;
  undefined4 uStack_4c;
  undefined4 uStack_48;
  undefined8 uStack_44;
  undefined8 local_38;
  undefined4 uStack_30;
  undefined4 uStack_2c;
  undefined4 uStack_28;
  undefined8 uStack_24;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var1;
  
  local_78.
  super__Tuple_impl<0UL,_int,_int,_int,_int,_int,_void_(*)(const_unsigned_char_*,_int,_int,_int,_int_*)>
  .super__Tuple_impl<1UL,_int,_int,_int,_int,_void_(*)(const_unsigned_char_*,_int,_int,_int,_int_*)>
  .super__Tuple_impl<2UL,_int,_int,_int,_void_(*)(const_unsigned_char_*,_int,_int,_int,_int_*)>.
  super__Tuple_impl<3UL,_int,_int,_void_(*)(const_unsigned_char_*,_int,_int,_int,_int_*)>.
  super__Tuple_impl<4UL,_int,_void_(*)(const_unsigned_char_*,_int,_int,_int,_int_*)>.
  super__Tuple_impl<5UL,_void_(*)(const_unsigned_char_*,_int,_int,_int,_int_*)>.
  super__Head_base<5UL,_void_(*)(const_unsigned_char_*,_int,_int,_int,_int_*),_false>._M_head_impl =
       (_Head_base<5UL,_void_(*)(const_unsigned_char_*,_int,_int,_int,_int_*),_false>)*in_RSI;
  local_78.
  super__Tuple_impl<0UL,_int,_int,_int,_int,_int,_void_(*)(const_unsigned_char_*,_int,_int,_int,_int_*)>
  ._20_8_ = *(undefined8 *)((long)in_RSI + 0x14);
  local_78.
  super__Tuple_impl<0UL,_int,_int,_int,_int,_int,_void_(*)(const_unsigned_char_*,_int,_int,_int,_int_*)>
  .super__Tuple_impl<1UL,_int,_int,_int,_int,_void_(*)(const_unsigned_char_*,_int,_int,_int,_int_*)>
  .super__Tuple_impl<2UL,_int,_int,_int,_void_(*)(const_unsigned_char_*,_int,_int,_int,_int_*)>.
  super__Head_base<2UL,_int,_false>._M_head_impl =
       (int)((ulong)*(undefined8 *)((long)in_RSI + 0xc) >> 0x20);
  local_78.
  super__Tuple_impl<0UL,_int,_int,_int,_int,_int,_void_(*)(const_unsigned_char_*,_int,_int,_int,_int_*)>
  .super__Tuple_impl<1UL,_int,_int,_int,_int,_void_(*)(const_unsigned_char_*,_int,_int,_int,_int_*)>
  .super__Tuple_impl<2UL,_int,_int,_int,_void_(*)(const_unsigned_char_*,_int,_int,_int,_int_*)>.
  super__Tuple_impl<3UL,_int,_int,_void_(*)(const_unsigned_char_*,_int,_int,_int,_int_*)>.
  super__Tuple_impl<4UL,_int,_void_(*)(const_unsigned_char_*,_int,_int,_int,_int_*)>.
  super__Head_base<4UL,_int,_false>._M_head_impl = (int)in_RSI[1];
  local_78.
  super__Tuple_impl<0UL,_int,_int,_int,_int,_int,_void_(*)(const_unsigned_char_*,_int,_int,_int,_int_*)>
  .super__Tuple_impl<1UL,_int,_int,_int,_int,_void_(*)(const_unsigned_char_*,_int,_int,_int,_int_*)>
  .super__Tuple_impl<2UL,_int,_int,_int,_void_(*)(const_unsigned_char_*,_int,_int,_int,_int_*)>.
  super__Tuple_impl<3UL,_int,_int,_void_(*)(const_unsigned_char_*,_int,_int,_int,_int_*)>.
  super__Tuple_impl<4UL,_int,_void_(*)(const_unsigned_char_*,_int,_int,_int,_int_*)>._12_4_ =
       SUB84((ulong)in_RSI[1] >> 0x20,0);
  local_58 = in_RSI[4];
  uStack_44 = *(undefined8 *)((long)in_RSI + 0x34);
  uStack_50 = (undefined4)in_RSI[5];
  uStack_4c = (undefined4)*(undefined8 *)((long)in_RSI + 0x2c);
  uStack_48 = (undefined4)((ulong)*(undefined8 *)((long)in_RSI + 0x2c) >> 0x20);
  local_38 = in_RSI[8];
  uStack_24 = *(undefined8 *)((long)in_RSI + 0x54);
  uStack_30 = (undefined4)in_RSI[9];
  uStack_2c = (undefined4)*(undefined8 *)((long)in_RSI + 0x4c);
  uStack_28 = (undefined4)((ulong)*(undefined8 *)((long)in_RSI + 0x4c) >> 0x20);
  __l._M_len = 3;
  __l._M_array = &local_78;
  std::
  vector<std::tuple<int,_int,_int,_int,_int,_void_(*)(const_unsigned_char_*,_int,_int,_int,_int_*)>,_std::allocator<std::tuple<int,_int,_int,_int,_int,_void_(*)(const_unsigned_char_*,_int,_int,_int,_int_*)>_>_>
  ::vector(&local_90,__l,&local_91);
  PVar2 = ValuesIn<__gnu_cxx::__normal_iterator<std::tuple<int,int,int,int,int,void(*)(unsigned_char_const*,int,int,int,int*)>const*,std::vector<std::tuple<int,int,int,int,int,void(*)(unsigned_char_const*,int,int,int,int*)>,std::allocator<std::tuple<int,int,int,int,int,void(*)(unsigned_char_const*,int,int,int,int*)>>>>>
                    ((testing *)this,
                     (__normal_iterator<const_std::tuple<int,_int,_int,_int,_int,_void_(*)(const_unsigned_char_*,_int,_int,_int,_int_*)>_*,_std::vector<std::tuple<int,_int,_int,_int,_int,_void_(*)(const_unsigned_char_*,_int,_int,_int,_int_*)>,_std::allocator<std::tuple<int,_int,_int,_int,_int,_void_(*)(const_unsigned_char_*,_int,_int,_int,_int_*)>_>_>_>
                      )local_90.
                       super__Vector_base<std::tuple<int,_int,_int,_int,_int,_void_(*)(const_unsigned_char_*,_int,_int,_int,_int_*)>,_std::allocator<std::tuple<int,_int,_int,_int,_int,_void_(*)(const_unsigned_char_*,_int,_int,_int,_int_*)>_>_>
                       ._M_impl.super__Vector_impl_data._M_start,
                     (__normal_iterator<const_std::tuple<int,_int,_int,_int,_int,_void_(*)(const_unsigned_char_*,_int,_int,_int,_int_*)>_*,_std::vector<std::tuple<int,_int,_int,_int,_int,_void_(*)(const_unsigned_char_*,_int,_int,_int,_int_*)>,_std::allocator<std::tuple<int,_int,_int,_int,_int,_void_(*)(const_unsigned_char_*,_int,_int,_int,_int_*)>_>_>_>
                      )local_90.
                       super__Vector_base<std::tuple<int,_int,_int,_int,_int,_void_(*)(const_unsigned_char_*,_int,_int,_int,_int_*)>,_std::allocator<std::tuple<int,_int,_int,_int,_int,_void_(*)(const_unsigned_char_*,_int,_int,_int,_int_*)>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish);
  _Var1._M_pi = PVar2.impl_.
                super___shared_ptr<const_testing::internal::ParamGeneratorInterface<std::tuple<int,_int,_int,_int,_int,_void_(*)(const_unsigned_char_*,_int,_int,_int,_int_*)>_>,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount._M_pi;
  if (local_90.
      super__Vector_base<std::tuple<int,_int,_int,_int,_int,_void_(*)(const_unsigned_char_*,_int,_int,_int,_int_*)>,_std::allocator<std::tuple<int,_int,_int,_int,_int,_void_(*)(const_unsigned_char_*,_int,_int,_int,_int_*)>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      (tuple<int,_int,_int,_int,_int,_void_(*)(const_unsigned_char_*,_int,_int,_int,_int_*)> *)0x0)
  {
    operator_delete(local_90.
                    super__Vector_base<std::tuple<int,_int,_int,_int,_int,_void_(*)(const_unsigned_char_*,_int,_int,_int,_int_*)>,_std::allocator<std::tuple<int,_int,_int,_int,_int,_void_(*)(const_unsigned_char_*,_int,_int,_int,_int_*)>_>_>
                    ._M_impl.super__Vector_impl_data._M_start);
    _Var1._M_pi = extraout_RDX;
  }
  PVar2.impl_.
  super___shared_ptr<const_testing::internal::ParamGeneratorInterface<std::tuple<int,_int,_int,_int,_int,_void_(*)(const_unsigned_char_*,_int,_int,_int,_int_*)>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = _Var1._M_pi;
  PVar2.impl_.
  super___shared_ptr<const_testing::internal::ParamGeneratorInterface<std::tuple<int,_int,_int,_int,_int,_void_(*)(const_unsigned_char_*,_int,_int,_int,_int_*)>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (element_type *)this;
  return (ParamGenerator<std::tuple<int,_int,_int,_int,_int,_void_(*)(const_unsigned_char_*,_int,_int,_int,_int_*)>_>
          )PVar2.impl_.
           super___shared_ptr<const_testing::internal::ParamGeneratorInterface<std::tuple<int,_int,_int,_int,_int,_void_(*)(const_unsigned_char_*,_int,_int,_int,_int_*)>_>,_(__gnu_cxx::_Lock_policy)2>
  ;
}

Assistant:

operator ParamGenerator<T>() const {  // NOLINT
    return ValuesIn(MakeVector<T>(MakeIndexSequence<sizeof...(Ts)>()));
  }